

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int handle_data_blocked_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  uint64_t uVar4;
  
  uVar4 = ptls_decode_quicint(&state->src,state->end);
  if (uVar4 == 0xffffffffffffffff) {
    iVar3 = 0x20007;
  }
  else {
    puVar1 = &(conn->ingress).max_data.sender.field_0x18;
    *puVar1 = *puVar1 | 1;
    iVar2 = should_send_max_data(conn);
    iVar3 = 0;
    if (iVar2 != 0) {
      (conn->egress).send_ack_at = 0;
    }
  }
  return iVar3;
}

Assistant:

static int handle_data_blocked_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_data_blocked_frame_t frame;
    int ret;

    if ((ret = quicly_decode_data_blocked_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    QUICLY_PROBE(DATA_BLOCKED_RECEIVE, conn, conn->stash.now, frame.offset);

    quicly_maxsender_request_transmit(&conn->ingress.max_data.sender);
    if (should_send_max_data(conn))
        conn->egress.send_ack_at = 0;

    return 0;
}